

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

bool __thiscall
MutableS2ShapeIndex::MakeIndexCell
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker)

{
  S2ClippedShape *this_00;
  bool bVar1;
  int iVar2;
  ShapeIdSet *this_01;
  reference ppCVar3;
  S2ShapeIndexCell *this_02;
  S2ClippedShape *pSVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference ppCVar7;
  reference piVar8;
  ulong uVar9;
  iterator iVar10;
  iterator iVar11;
  S2CellId local_178;
  uint64 local_170;
  S2Point local_168;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_150;
  int local_148;
  S2CellId local_140;
  pair<S2CellId,_S2ShapeIndexCell_*> local_138;
  pair<const_S2CellId,_S2ShapeIndexCell_*> local_128;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_118;
  int local_110;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_108;
  int local_100;
  int local_f8;
  int local_f4;
  int e;
  int ebegin;
  int local_e8;
  int local_e4;
  int cshape_id;
  int eshape_id;
  S2ClippedShape *clipped;
  const_iterator cStack_d0;
  int i;
  const_iterator cnext;
  int enext;
  S2ClippedShape *base;
  S2ShapeIndexCell *local_a8;
  S2ShapeIndexCell *cell;
  ShapeIdSet *pSStack_98;
  int num_shapes;
  ShapeIdSet *cshape_ids;
  S2Point local_78;
  uint64 local_60;
  ClippedEdge *local_58;
  ClippedEdge *edge;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range1;
  int count;
  InteriorTracker *tracker_local;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *edges_local;
  S2PaddedCell *pcell_local;
  MutableS2ShapeIndex *this_local;
  
  bVar1 = std::
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ::empty(edges);
  if (bVar1) {
    this_01 = InteriorTracker::shape_ids(tracker);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(this_01);
    if (bVar1) {
      return true;
    }
  }
  __range1._4_4_ = 0;
  __end1 = std::
           vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ::begin(edges);
  edge = (ClippedEdge *)
         std::
         vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
         ::end(edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
                                *)&edge);
    if (!bVar1) {
      bVar1 = InteriorTracker::is_active(tracker);
      if ((bVar1) &&
         (bVar1 = std::
                  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  ::empty(edges), !bVar1)) {
        local_60 = (uint64)S2PaddedCell::id(pcell);
        bVar1 = InteriorTracker::at_cellid(tracker,(S2CellId)local_60);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          S2PaddedCell::GetEntryVertex(&local_78,pcell);
          InteriorTracker::MoveTo(tracker,&local_78);
        }
        S2PaddedCell::GetCenter((S2Point *)&cshape_ids,pcell);
        InteriorTracker::DrawTo(tracker,(S2Point *)&cshape_ids);
        TestAllEdges(edges,tracker);
      }
      pSStack_98 = InteriorTracker::shape_ids(tracker);
      cell._4_4_ = CountShapes(edges,pSStack_98);
      this_02 = (S2ShapeIndexCell *)operator_new(0x10);
      S2ShapeIndexCell::S2ShapeIndexCell(this_02);
      local_a8 = this_02;
      pSVar4 = S2ShapeIndexCell::add_shapes(this_02,cell._4_4_);
      cnext._M_current._4_4_ = 0;
      cStack_d0 = std::vector<int,_std::allocator<int>_>::begin(pSStack_98);
      for (clipped._4_4_ = 0; clipped._4_4_ < cell._4_4_; clipped._4_4_ = clipped._4_4_ + 1) {
        _cshape_id = pSVar4 + clipped._4_4_;
        local_e8 = num_shape_ids(this);
        sVar5 = (size_type)cnext._M_current._4_4_;
        local_e4 = local_e8;
        sVar6 = std::
                vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                ::size(edges);
        if (sVar5 != sVar6) {
          ppCVar7 = std::
                    vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ::operator[](edges,(long)cnext._M_current._4_4_);
          local_e4 = (*ppCVar7)->face_edge->shape_id;
        }
        _e = std::vector<int,_std::allocator<int>_>::end(pSStack_98);
        bVar1 = __gnu_cxx::operator!=
                          (&stack0xffffffffffffff30,
                           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)&e);
        if (bVar1) {
          piVar8 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&stack0xffffffffffffff30);
          local_e8 = *piVar8;
        }
        local_f4 = cnext._M_current._4_4_;
        if (local_e8 < local_e4) {
          S2ClippedShape::Init(_cshape_id,local_e8,0);
          S2ClippedShape::set_contains_center(_cshape_id,true);
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&stack0xffffffffffffff30);
        }
        else {
          while( true ) {
            uVar9 = (ulong)cnext._M_current._4_4_;
            sVar5 = std::
                    vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ::size(edges);
            bVar1 = false;
            if (uVar9 < sVar5) {
              ppCVar7 = std::
                        vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                        ::operator[](edges,(long)cnext._M_current._4_4_);
              bVar1 = (*ppCVar7)->face_edge->shape_id == local_e4;
            }
            if (!bVar1) break;
            cnext._M_current._4_4_ = cnext._M_current._4_4_ + 1;
          }
          S2ClippedShape::Init(_cshape_id,local_e4,cnext._M_current._4_4_ - local_f4);
          for (local_f8 = local_f4; this_00 = _cshape_id, local_f8 < cnext._M_current._4_4_;
              local_f8 = local_f8 + 1) {
            iVar2 = local_f8 - local_f4;
            ppCVar7 = std::
                      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                      ::operator[](edges,(long)local_f8);
            S2ClippedShape::set_edge(this_00,iVar2,(*ppCVar7)->face_edge->edge_id);
          }
          if (local_e8 == local_e4) {
            S2ClippedShape::set_contains_center(_cshape_id,true);
            __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator++(&stack0xffffffffffffff30);
          }
        }
      }
      iVar10 = gtl::internal_btree::
               btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
               ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                      *)&this->cell_map_);
      local_118 = iVar10.node;
      local_110 = iVar10.position;
      local_108 = local_118;
      local_100 = local_110;
      local_140 = S2PaddedCell::id(pcell);
      local_138 = std::make_pair<S2CellId,S2ShapeIndexCell*&>(&local_140,&local_a8);
      std::pair<const_S2CellId,_S2ShapeIndexCell_*>::pair<S2CellId,_S2ShapeIndexCell_*,_true>
                (&local_128,&local_138);
      iVar11.position = local_100;
      iVar11.node = local_108;
      iVar11._12_4_ = 0;
      iVar11 = gtl::internal_btree::
               btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
               ::insert((btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                         *)&this->cell_map_,iVar11,&local_128);
      local_150 = iVar11.node;
      local_148 = iVar11.position;
      bVar1 = InteriorTracker::is_active(tracker);
      if ((bVar1) &&
         (bVar1 = std::
                  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  ::empty(edges), !bVar1)) {
        S2PaddedCell::GetExitVertex(&local_168,pcell);
        InteriorTracker::DrawTo(tracker,&local_168);
        TestAllEdges(edges,tracker);
        local_178 = S2PaddedCell::id(pcell);
        local_170 = (uint64)S2CellId::next(&local_178);
        InteriorTracker::set_next_cellid(tracker,(S2CellId)local_170);
      }
      return true;
    }
    ppCVar3 = __gnu_cxx::
              __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
              ::operator*(&__end1);
    local_58 = *ppCVar3;
    iVar2 = S2PaddedCell::level(pcell);
    __range1._4_4_ = (uint)(iVar2 < local_58->face_edge->max_level) + __range1._4_4_;
    iVar2 = Options::max_edges_per_cell(&this->options_);
    if (iVar2 < __range1._4_4_) break;
    __gnu_cxx::
    __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool MutableS2ShapeIndex::MakeIndexCell(const S2PaddedCell& pcell,
                                        const vector<const ClippedEdge*>& edges,
                                        InteriorTracker* tracker) {
  if (edges.empty() && tracker->shape_ids().empty()) {
    // No index cell is needed.  (In most cases this situation is detected
    // before we get to this point, but this can happen when all shapes in a
    // cell are removed.)
    return true;
  }

  // Count the number of edges that have not reached their maximum level yet.
  // Return false if there are too many such edges.
  int count = 0;
  for (const ClippedEdge* edge : edges) {
    count += (pcell.level() < edge->face_edge->max_level);
    if (count > options_.max_edges_per_cell())
      return false;
  }

  // Possible optimization: Continue subdividing as long as exactly one child
  // of "pcell" intersects the given edges.  This can be done by finding the
  // bounding box of all the edges and calling ShrinkToFit():
  //
  // S2CellId cellid = pcell.ShrinkToFit(GetRectBound(edges));
  //
  // Currently this is not beneficial; it slows down construction by 4-25%
  // (mainly computing the union of the bounding rectangles) and also slows
  // down queries (since more recursive clipping is required to get down to
  // the level of a spatial index cell).  But it may be worth trying again
  // once "contains_center" is computed and all algorithms are modified to
  // take advantage of it.

  // We update the InteriorTracker as follows.  For every S2Cell in the index
  // we construct two edges: one edge from entry vertex of the cell to its
  // center, and one from the cell center to its exit vertex.  Here "entry"
  // and "exit" refer the S2CellId ordering, i.e. the order in which points
  // are encountered along the S2 space-filling curve.  The exit vertex then
  // becomes the entry vertex for the next cell in the index, unless there are
  // one or more empty intervening cells, in which case the InteriorTracker
  // state is unchanged because the intervening cells have no edges.

  // Shift the InteriorTracker focus point to the center of the current cell.
  if (tracker->is_active() && !edges.empty()) {
    if (!tracker->at_cellid(pcell.id())) {
      tracker->MoveTo(pcell.GetEntryVertex());
    }
    tracker->DrawTo(pcell.GetCenter());
    TestAllEdges(edges, tracker);
  }
  // Allocate and fill a new index cell.  To get the total number of shapes we
  // need to merge the shapes associated with the intersecting edges together
  // with the shapes that happen to contain the cell center.
  const ShapeIdSet& cshape_ids = tracker->shape_ids();
  int num_shapes = CountShapes(edges, cshape_ids);
  S2ShapeIndexCell* cell = new S2ShapeIndexCell;
  S2ClippedShape* base = cell->add_shapes(num_shapes);

  // To fill the index cell we merge the two sources of shapes: "edge shapes"
  // (those that have at least one edge that intersects this cell), and
  // "containing shapes" (those that contain the cell center).  We keep track
  // of the index of the next intersecting edge and the next containing shape
  // as we go along.  Both sets of shape ids are already sorted.
  int enext = 0;
  ShapeIdSet::const_iterator cnext = cshape_ids.begin();
  for (int i = 0; i < num_shapes; ++i) {
    S2ClippedShape* clipped = base + i;
    int eshape_id = num_shape_ids(), cshape_id = eshape_id;  // Sentinels
    if (enext != edges.size()) {
      eshape_id = edges[enext]->face_edge->shape_id;
    }
    if (cnext != cshape_ids.end()) {
      cshape_id = *cnext;
    }
    int ebegin = enext;
    if (cshape_id < eshape_id) {
      // The entire cell is in the shape interior.
      clipped->Init(cshape_id, 0);
      clipped->set_contains_center(true);
      ++cnext;
    } else {
      // Count the number of edges for this shape and allocate space for them.
      while (enext < edges.size() &&
             edges[enext]->face_edge->shape_id == eshape_id) {
        ++enext;
      }
      clipped->Init(eshape_id, enext - ebegin);
      for (int e = ebegin; e < enext; ++e) {
        clipped->set_edge(e - ebegin, edges[e]->face_edge->edge_id);
      }
      if (cshape_id == eshape_id) {
        clipped->set_contains_center(true);
        ++cnext;
      }
    }
  }
  // UpdateEdges() visits cells in increasing order of S2CellId, so during
  // initial construction of the index all insertions happen at the end.  It
  // is much faster to give an insertion hint in this case.  Otherwise the
  // hint doesn't do much harm.  With more effort we could provide a hint even
  // during incremental updates, but this is probably not worth the effort.
  cell_map_.insert(cell_map_.end(), std::make_pair(pcell.id(), cell));

  // Shift the InteriorTracker focus point to the exit vertex of this cell.
  if (tracker->is_active() && !edges.empty()) {
    tracker->DrawTo(pcell.GetExitVertex());
    TestAllEdges(edges, tracker);
    tracker->set_next_cellid(pcell.id().next());
  }
  return true;
}